

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  curl_slist *pcVar4;
  bool bVar5;
  char *pcVar6;
  void *pvVar7;
  bool bVar8;
  char in_AL;
  int iVar9;
  long *plVar10;
  char *pcVar11;
  long *plVar12;
  void **ppvVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  curl_httppost *pcVar17;
  uint uVar18;
  undefined8 in_RCX;
  ulong uVar19;
  curl_httppost *pcVar20;
  undefined8 in_RDX;
  curl_httppost **ppcVar21;
  CURLFORMcode CVar22;
  size_t sVar23;
  undefined8 in_R8;
  long *plVar24;
  undefined8 in_R9;
  int *piVar25;
  FormInfo *ptr_1;
  FormInfo *ptr;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  char *local_150;
  char *local_148;
  char *local_140;
  ulong local_138;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar18 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar10 = (long *)(*Curl_ccalloc)(1,0x68);
  if (plVar10 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar14 = (char *)0x0;
  piVar25 = (int *)0x0;
  CVar22 = CURL_FORMADD_OK;
  plVar24 = plVar10;
  bVar5 = false;
switchD_005d321c_caseD_9:
  plVar12 = plVar10;
  if (CVar22 == CURL_FORMADD_OK) {
    if ((bool)(piVar25 != (int *)0x0 & bVar5)) goto code_r0x005d31b8;
    uVar19 = (ulong)uVar18;
    if (uVar19 < 0x29) {
      uVar18 = uVar18 + 8;
      ppvVar13 = (void **)((long)local_e8 + uVar19);
    }
    else {
      ppvVar13 = local_160;
      local_160 = local_160 + 1;
    }
    iVar9 = *(int *)ppvVar13;
    if (iVar9 != 0x11) goto LAB_005d3209;
    local_150 = (char *)0x0;
    pcVar20 = (curl_httppost *)0x0;
    plVar24 = plVar10;
    goto LAB_005d39c6;
  }
  do {
    if ((char)plVar12[0xc] == '\x01') {
      (*Curl_cfree)((void *)*plVar12);
      *plVar12 = 0;
      *(undefined1 *)(plVar12 + 0xc) = 0;
    }
    if (*(char *)((long)plVar12 + 0x61) == '\x01') {
      (*Curl_cfree)((void *)plVar12[2]);
      plVar12[2] = 0;
      *(undefined1 *)((long)plVar12 + 0x61) = 0;
    }
    if (*(char *)((long)plVar12 + 0x62) == '\x01') {
      (*Curl_cfree)((void *)plVar12[4]);
      plVar12[4] = 0;
      *(undefined1 *)((long)plVar12 + 0x62) = 0;
    }
    if (*(char *)((long)plVar12 + 99) == '\x01') {
      (*Curl_cfree)((void *)plVar12[8]);
      plVar12[8] = 0;
      *(undefined1 *)((long)plVar12 + 99) = 0;
    }
    plVar24 = plVar12 + 0xb;
    plVar12 = (long *)*plVar24;
  } while ((long *)*plVar24 != (long *)0x0);
  goto LAB_005d398b;
code_r0x005d31b8:
  iVar9 = *piVar25;
  pcVar14 = *(char **)(piVar25 + 2);
  piVar25 = piVar25 + 4;
  CVar22 = CURL_FORMADD_OK;
  bVar5 = false;
  if (iVar9 == 0x11) goto switchD_005d321c_caseD_9;
  bVar5 = true;
LAB_005d3209:
  CVar22 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar11 = pcVar14;
  switch(iVar9) {
  case 2:
    *(byte *)(plVar24 + 5) = *(byte *)(plVar24 + 5) | 4;
  case 1:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar24 == 0) {
      if (!bVar5) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar11 = (char *)*ppvVar13;
      }
      CVar22 = CURL_FORMADD_NULL;
      if (pcVar11 != (char *)0x0) {
        *plVar24 = (long)pcVar11;
        CVar22 = CURL_FORMADD_OK;
      }
    }
    goto switchD_005d321c_caseD_9;
  case 3:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[1] == 0) {
      if (!bVar5) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar11 = (char *)*ppvVar13;
      }
      plVar24[1] = (long)pcVar11;
      CVar22 = CURL_FORMADD_OK;
    }
    goto switchD_005d321c_caseD_9;
  case 5:
    *(byte *)(plVar24 + 5) = *(byte *)(plVar24 + 5) | 8;
  case 4:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[2] != 0) goto switchD_005d321c_caseD_9;
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_005d321c_caseD_9;
    break;
  case 7:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar24 + 5) & 10) != 0) goto switchD_005d321c_caseD_9;
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_005d321c_caseD_9;
    pcVar11 = (*Curl_cstrdup)(pcVar11);
    plVar24[2] = (long)pcVar11;
    CVar22 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_005d321c_caseD_9;
    *(byte *)(plVar24 + 5) = *(byte *)(plVar24 + 5) | 2;
    goto LAB_005d38e9;
  case 8:
    CVar22 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar8 = !bVar5;
    bVar5 = true;
    if (bVar8) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      piVar25 = (int *)*ppvVar13;
      bVar5 = piVar25 != (int *)0x0;
      CVar22 = (uint)(piVar25 == (int *)0x0) * 3;
    }
  default:
    goto switchD_005d321c_caseD_9;
  case 10:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    if (plVar24[2] != 0) {
      CVar22 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar24 + 5) & 1) == 0) ||
         (CVar22 = CURL_FORMADD_NULL, pcVar11 == (char *)0x0)) goto switchD_005d321c_caseD_9;
      local_148 = (*Curl_cstrdup)(pcVar11);
      CVar22 = CURL_FORMADD_MEMORY;
      if (local_148 == (char *)0x0) goto switchD_005d321c_caseD_9;
      plVar12 = (long *)(*Curl_ccalloc)(1,0x68);
      if (plVar12 == (long *)0x0) goto LAB_005d38f5;
      plVar12[2] = (long)local_148;
      plVar12[5] = 1;
      plVar12[0xb] = plVar24[0xb];
      plVar24[0xb] = (long)plVar12;
      *(undefined1 *)((long)plVar12 + 0x61) = 1;
      goto LAB_005d36fb;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_005d321c_caseD_9;
    pcVar11 = (*Curl_cstrdup)(pcVar11);
    plVar24[2] = (long)pcVar11;
    CVar22 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_005d321c_caseD_9;
    *(byte *)(plVar24 + 5) = *(byte *)(plVar24 + 5) | 1;
LAB_005d38e9:
    *(undefined1 *)((long)plVar24 + 0x61) = 1;
    CVar22 = CURL_FORMADD_OK;
    goto switchD_005d321c_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[8] == 0) {
      pcVar11 = (*Curl_cstrdup)(pcVar11);
      plVar24[8] = (long)pcVar11;
      CVar22 = CURL_FORMADD_MEMORY;
      if (pcVar11 != (char *)0x0) {
        *(undefined1 *)((long)plVar24 + 99) = 1;
        CVar22 = CURL_FORMADD_OK;
      }
    }
    goto switchD_005d321c_caseD_9;
  case 0xc:
    *(byte *)(plVar24 + 5) = *(byte *)(plVar24 + 5) | 0x30;
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[6] != 0) goto switchD_005d321c_caseD_9;
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_005d321c_caseD_9;
    plVar24[6] = (long)pcVar11;
    break;
  case 0xd:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[7] == 0) {
      if (!bVar5) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar11 = (char *)*ppvVar13;
      }
      plVar24[7] = (long)pcVar11;
      CVar22 = CURL_FORMADD_OK;
    }
    goto switchD_005d321c_caseD_9;
  case 0xe:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    if (plVar24[4] == 0) {
      CVar22 = CURL_FORMADD_NULL;
      if (pcVar11 != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        plVar24[4] = (long)pcVar11;
        CVar22 = CURL_FORMADD_MEMORY;
        if (pcVar11 != (char *)0x0) {
          *(undefined1 *)((long)plVar24 + 0x62) = 1;
          CVar22 = CURL_FORMADD_OK;
        }
      }
      goto switchD_005d321c_caseD_9;
    }
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (((*(byte *)(plVar24 + 5) & 1) == 0) || (CVar22 = CURL_FORMADD_NULL, pcVar11 == (char *)0x0))
    goto switchD_005d321c_caseD_9;
    local_148 = (*Curl_cstrdup)(pcVar11);
    CVar22 = CURL_FORMADD_MEMORY;
    if (local_148 == (char *)0x0) goto switchD_005d321c_caseD_9;
    plVar12 = (long *)(*Curl_ccalloc)(1,0x68);
    if (plVar12 == (long *)0x0) {
LAB_005d38f5:
      CVar22 = CURL_FORMADD_MEMORY;
      (*Curl_cfree)(local_148);
      goto switchD_005d321c_caseD_9;
    }
    plVar12[4] = (long)local_148;
    plVar12[5] = 1;
    plVar12[0xb] = plVar24[0xb];
    plVar24[0xb] = (long)plVar12;
    *(undefined1 *)((long)plVar12 + 0x62) = 1;
LAB_005d36fb:
    CVar22 = CURL_FORMADD_OK;
    plVar24 = plVar12;
    goto switchD_005d321c_caseD_9;
  case 0xf:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[10] == 0) {
      plVar24[10] = (long)pcVar11;
      CVar22 = CURL_FORMADD_OK;
    }
    goto switchD_005d321c_caseD_9;
  case 0x13:
    *(byte *)(plVar24 + 5) = *(byte *)(plVar24 + 5) | 0x40;
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[9] != 0) goto switchD_005d321c_caseD_9;
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_005d321c_caseD_9;
    plVar24[9] = (long)pcVar11;
    break;
  case 0x14:
    *(byte *)(plVar24 + 5) = *(byte *)(plVar24 + 5) | 0x80;
  case 6:
    if (!bVar5) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    plVar24[3] = (long)pcVar11;
    CVar22 = CURL_FORMADD_OK;
    goto switchD_005d321c_caseD_9;
  }
  plVar24[2] = (long)pcVar11;
  CVar22 = CURL_FORMADD_OK;
  goto switchD_005d321c_caseD_9;
LAB_005d39c6:
  pcVar14 = (char *)*plVar24;
  if (pcVar14 == (char *)0x0) {
    if (pcVar20 == (curl_httppost *)0x0) goto LAB_005d3d4e;
LAB_005d39e6:
    uVar19 = plVar24[5];
    CVar22 = CURL_FORMADD_INCOMPLETE;
    if (((((plVar24[3] != 0 & (byte)uVar19) != 0) || (((uint)uVar19 & 9) == 9)) ||
        (uVar18 = ~(uint)uVar19, (uVar18 & 10) == 0)) || ((uVar18 & 0x30) == 0 && plVar24[6] == 0))
    goto LAB_005d3cd4;
    if (((uVar19 & 0x11) != 0) && (plVar24[4] == 0)) {
      plVar12 = plVar24 + 8;
      if ((uVar19 & 0x10) == 0) {
        plVar12 = plVar24 + 2;
      }
      pcVar14 = Curl_mime_contenttype((char *)*plVar12);
      if (pcVar14 == (char *)0x0) {
        pcVar14 = local_150;
      }
      if (pcVar14 == (char *)0x0) {
        pcVar14 = "application/octet-stream";
      }
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      plVar24[4] = (long)pcVar14;
      if (pcVar14 != (char *)0x0) {
        *(undefined1 *)((long)plVar24 + 0x62) = 1;
        pcVar14 = (char *)*plVar24;
        goto LAB_005d3a8d;
      }
LAB_005d3d58:
      CVar22 = CURL_FORMADD_MEMORY;
      goto LAB_005d3cd4;
    }
LAB_005d3a8d:
    if (pcVar14 == (char *)0x0) {
      local_138 = plVar24[5];
      if (plVar24 != plVar10 || (local_138 & 4) != 0) {
        pcVar14 = (char *)0x0;
        goto LAB_005d3b24;
      }
      goto LAB_005d3d58;
    }
    sVar23 = plVar24[1];
    if (sVar23 == 0) {
      local_138 = plVar24[5];
      if (plVar24 == plVar10 && (local_138 & 4) == 0) {
        sVar16 = strlen(pcVar14);
        sVar23 = sVar16 + 1;
        goto LAB_005d3b06;
      }
    }
    else {
      sVar15 = 0;
      do {
        if (pcVar14[sVar15] == '\0') {
          CVar22 = CURL_FORMADD_NULL;
          goto LAB_005d3cd4;
        }
        sVar15 = sVar15 + 1;
      } while (sVar23 != sVar15);
      local_138 = plVar24[5];
      if (plVar24 == plVar10 && (local_138 & 4) == 0) {
LAB_005d3b06:
        pcVar14 = (char *)Curl_memdup(pcVar14,sVar23);
        *plVar24 = (long)pcVar14;
        if (pcVar14 == (char *)0x0) goto LAB_005d3d58;
        *(undefined1 *)(plVar24 + 0xc) = 1;
        local_138 = plVar24[5];
      }
    }
LAB_005d3b24:
    local_140 = (char *)plVar24[2];
    if ((local_138 & 0x6b) == 0) {
      if (local_140 == (char *)0x0) {
        local_140 = (char *)0x0;
      }
      else {
        sVar23 = plVar24[3];
        if (sVar23 == 0) {
          sVar16 = strlen(local_140);
          sVar23 = sVar16 + 1;
        }
        local_140 = (char *)Curl_memdup(local_140,sVar23);
        plVar24[2] = (long)local_140;
        if (local_140 == (char *)0x0) goto LAB_005d3d58;
        *(undefined1 *)((long)plVar24 + 0x61) = 1;
        pcVar14 = (char *)*plVar24;
        local_138 = plVar24[5];
      }
    }
    sVar16 = plVar24[1];
    lVar1 = plVar24[3];
    pcVar11 = (char *)plVar24[6];
    lVar2 = plVar24[7];
    pcVar3 = (char *)plVar24[4];
    pcVar4 = (curl_slist *)plVar24[10];
    pcVar6 = (char *)plVar24[8];
    pvVar7 = (void *)plVar24[9];
    if (pcVar14 != (char *)0x0 && sVar16 == 0) {
      sVar16 = strlen(pcVar14);
    }
    CVar22 = CURL_FORMADD_MEMORY;
    if (((lVar2 < 0) || ((long)sVar16 < 0)) ||
       (pcVar17 = (curl_httppost *)(*Curl_ccalloc)(1,0x70), pcVar17 == (curl_httppost *)0x0))
    goto LAB_005d3cd4;
    pcVar17->name = pcVar14;
    pcVar17->namelength = sVar16;
    pcVar17->contents = local_140;
    pcVar17->contentlen = lVar1;
    pcVar17->buffer = pcVar11;
    pcVar17->bufferlength = lVar2;
    pcVar17->contenttype = pcVar3;
    pcVar17->contentheader = pcVar4;
    pcVar17->showfilename = pcVar6;
    pcVar17->userp = pvVar7;
    pcVar17->flags = local_138 | 0x80;
    if (pcVar20 == (curl_httppost *)0x0) {
      pcVar20 = *last_post;
      if (*last_post == (curl_httppost *)0x0) {
        pcVar20 = (curl_httppost *)httppost;
      }
      pcVar20->next = pcVar17;
      ppcVar21 = last_post;
    }
    else {
      pcVar17->more = pcVar20->more;
      ppcVar21 = &pcVar20->more;
    }
    *ppcVar21 = pcVar17;
    if ((char *)plVar24[4] != (char *)0x0) {
      local_150 = (char *)plVar24[4];
    }
    plVar24 = (long *)plVar24[0xb];
    CVar22 = CURL_FORMADD_OK;
    pcVar20 = pcVar17;
    if (plVar24 == (long *)0x0) goto LAB_005d398b;
    goto LAB_005d39c6;
  }
  if (plVar24[2] != 0 || pcVar20 != (curl_httppost *)0x0) goto LAB_005d39e6;
LAB_005d3d4e:
  CVar22 = CURL_FORMADD_INCOMPLETE;
LAB_005d3cd4:
  do {
    if ((char)plVar24[0xc] == '\x01') {
      (*Curl_cfree)((void *)*plVar24);
      *plVar24 = 0;
      *(undefined1 *)(plVar24 + 0xc) = 0;
    }
    if (*(char *)((long)plVar24 + 0x61) == '\x01') {
      (*Curl_cfree)((void *)plVar24[2]);
      plVar24[2] = 0;
      *(undefined1 *)((long)plVar24 + 0x61) = 0;
    }
    if (*(char *)((long)plVar24 + 0x62) == '\x01') {
      (*Curl_cfree)((void *)plVar24[4]);
      plVar24[4] = 0;
      *(undefined1 *)((long)plVar24 + 0x62) = 0;
    }
    if (*(char *)((long)plVar24 + 99) == '\x01') {
      (*Curl_cfree)((void *)plVar24[8]);
      plVar24[8] = 0;
      *(undefined1 *)((long)plVar24 + 99) = 0;
    }
    plVar24 = (long *)plVar24[0xb];
  } while (plVar24 != (long *)0x0);
LAB_005d398b:
  do {
    plVar24 = (long *)plVar10[0xb];
    (*Curl_cfree)(plVar10);
    plVar10 = plVar24;
  } while (plVar24 != (long *)0x0);
  return CVar22;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}